

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

void M2TSStreamInfo::blurayStreamParams
               (double fps,bool interlaced,uint width,uint height,VideoAspectRatio ar,
               uint8_t *video_format,uint8_t *frame_rate_index,uint8_t *aspect_ratio_index)

{
  undefined1 auVar1 [16];
  uint8_t uVar2;
  bool bVar3;
  undefined4 uVar4;
  int iVar5;
  undefined8 in_RAX;
  
  *frame_rate_index = '\0';
  *aspect_ratio_index = '\x03';
  if ((0x1e0 < height || 0x356 < width) || (ABS(25.0 - fps) < 0.5)) {
    uVar4 = 0;
  }
  else {
    uVar4 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),0.5 <= ABS(50.0 - fps));
  }
  if (height < 0x241 && width < 0x401) {
    if ((char)uVar4 != '\0') {
LAB_001e577d:
      uVar2 = !interlaced * '\x02' + '\x01';
      goto LAB_001e5785;
    }
    auVar1._8_8_ = -(ulong)(ABS(50.0 - fps) < 0.5);
    auVar1._0_8_ = -(ulong)(ABS(25.0 - fps) < 0.5);
    iVar5 = movmskpd(uVar4,auVar1);
    uVar2 = '\x05';
    if (iVar5 != 0) {
      uVar2 = !interlaced * '\x05' + '\x02';
    }
    *video_format = uVar2;
  }
  else {
    if ((char)uVar4 != '\0') goto LAB_001e577d;
    if (0xa27 < width) {
      *video_format = '\b';
      goto LAB_001e581c;
    }
    uVar2 = '\x05';
    if (0x513 < width) {
      *video_format = !interlaced * '\x02' | 4;
      goto LAB_001e581c;
    }
LAB_001e5785:
    *video_format = uVar2;
    if (0x437 < width) goto LAB_001e581c;
  }
  bVar3 = isV3();
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Warning: video height < 1080 is not standard for V3 Blu-ray.",
               0x3c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    sLastMsg = true;
  }
LAB_001e581c:
  if (interlaced) {
    bVar3 = isV3();
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Warning: interlaced video is not standard for V3 Blu-ray.",
                 0x39);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      sLastMsg = true;
    }
  }
  uVar2 = '\x01';
  if ((((ABS(fps + -23.976) < 0.0001) || (uVar2 = '\x02', ABS(fps + -24.0) < 0.0001)) ||
      (uVar2 = '\x03', ABS(fps + -25.0) < 0.0001)) ||
     (((uVar2 = '\x04', ABS(fps + -29.97) < 0.0001 || (uVar2 = '\x06', ABS(fps + -50.0) < 0.0001))
      || (uVar2 = '\a', ABS(fps + -59.94) < 0.0001)))) {
    *frame_rate_index = uVar2;
  }
  if (ar - AR_VGA < 2) {
    *aspect_ratio_index = '\x02';
  }
  return;
}

Assistant:

void M2TSStreamInfo::blurayStreamParams(const double fps, const bool interlaced, const unsigned width,
                                        const unsigned height, const VideoAspectRatio ar, uint8_t* video_format,
                                        uint8_t* frame_rate_index, uint8_t* aspect_ratio_index)
{
    *video_format = 0;
    *frame_rate_index = 0;
    *aspect_ratio_index = 3;  // 16:9; 2 = 4:3

    const bool isNtsc = width <= 854 && height <= 480 && (fabs(25 - fps) >= 0.5 && fabs(50 - fps) >= 0.5);
    const bool isPal = width <= 1024 && height <= 576 && (fabs(25 - fps) < 0.5 || fabs(50 - fps) < 0.5);
    if (isNtsc)
        *video_format = interlaced ? 1 : 3;
    else if (isPal)
        *video_format = interlaced ? 2 : 7;
    else if (width >= 2600)
        *video_format = 8;
    else if (width >= 1300)
        *video_format = interlaced ? 4 : 6;  // as 1920x1080
    else
        *video_format = 5;  // as 1280x720

    if (width < 1080 && isV3())
        LTRACE(LT_WARN, 2, "Warning: video height < 1080 is not standard for V3 Blu-ray.");
    if (interlaced && isV3())
        LTRACE(LT_WARN, 2, "Warning: interlaced video is not standard for V3 Blu-ray.");

    if (fabs(fps - 23.976) < 1e-4)
        *frame_rate_index = 1;
    else if (fabs(fps - 24.0) < 1e-4)
        *frame_rate_index = 2;
    else if (fabs(fps - 25.0) < 1e-4)
        *frame_rate_index = 3;
    else if (fabs(fps - 29.97) < 1e-4)
        *frame_rate_index = 4;
    else if (fabs(fps - 50.0) < 1e-4)
        *frame_rate_index = 6;
    else if (fabs(fps - 59.94) < 1e-4)
        *frame_rate_index = 7;

    if (ar == VideoAspectRatio::AR_3_4 || ar == VideoAspectRatio::AR_VGA)
        *aspect_ratio_index = 2;  // 4x3
}